

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O3

void __thiscall DSuicider::Tick(DSuicider *this)

{
  ActorFlags *pAVar1;
  byte *pbVar2;
  double dVar3;
  APlayerPawn *pAVar4;
  FName local_14;
  DAngle local_10;
  
  pAVar4 = (this->Pawn).field_0.p;
  pAVar1 = &(pAVar4->super_AActor).flags;
  pAVar1->Value = pAVar1->Value | 4;
  pbVar2 = (byte *)((long)&(pAVar4->super_AActor).flags2.Value + 3);
  *pbVar2 = *pbVar2 & 0xf7;
  dVar3 = (pAVar4->super_AActor).DamageFactor;
  (pAVar4->super_AActor).DamageFactor = 1.0;
  local_14.Index = 0xbe;
  local_10.Degrees = 0.0;
  P_DamageMobj(&pAVar4->super_AActor,&pAVar4->super_AActor,&pAVar4->super_AActor,1000000,&local_14,0
               ,&local_10);
  pAVar4 = (this->Pawn).field_0.p;
  (pAVar4->super_AActor).DamageFactor = dVar3;
  if ((pAVar4->super_AActor).health < 1) {
    pAVar1 = &(pAVar4->super_AActor).flags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value & 0xfb;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void Tick()
	{
		Pawn->flags |= MF_SHOOTABLE;
		Pawn->flags2 &= ~MF2_INVULNERABLE;
		// Store the player's current damage factor, to restore it later.
		double plyrdmgfact = Pawn->DamageFactor;
		Pawn->DamageFactor = 1.;
		P_DamageMobj (Pawn, Pawn, Pawn, TELEFRAG_DAMAGE, NAME_Suicide);
		Pawn->DamageFactor = plyrdmgfact;
		if (Pawn->health <= 0)
		{
			Pawn->flags &= ~MF_SHOOTABLE;
		}
		Destroy();
	}